

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crossover.cc
# Opt level: O0

void __thiscall
ipx::Crossover::PushPrimal
          (Crossover *this,Basis *basis,Vector *x,vector<int,_std::allocator<int>_> *variables,
          Vector *z,Info *info)

{
  valarray<bool> bound_restrict;
  Info *in_stack_00000658;
  bool *in_stack_00000660;
  vector<int,_std::allocator<int>_> *in_stack_00000668;
  Vector *in_stack_00000670;
  Basis *in_stack_00000678;
  Crossover *in_stack_00000680;
  valarray<bool> *this_00;
  value_type_conflict1 *in_stack_ffffffffffffff78;
  valarray<double> *in_stack_ffffffffffffff80;
  _Expr<std::__detail::_BinClos<std::__not_equal_to,_std::_ValArray,_std::_Constant,_double,_double>,_bool>
  *in_stack_ffffffffffffff88;
  valarray<bool> *in_stack_ffffffffffffff90;
  valarray<bool> local_40 [4];
  
  std::operator!=(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  this_00 = local_40;
  std::valarray<bool>::
  valarray<std::__detail::_BinClos<std::__not_equal_to,std::_ValArray,std::_Constant,double,double>>
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  std::valarray<bool>::operator[](this_00,0);
  PushPrimal(in_stack_00000680,in_stack_00000678,in_stack_00000670,in_stack_00000668,
             in_stack_00000660,in_stack_00000658);
  std::valarray<bool>::~valarray(this_00);
  return;
}

Assistant:

void Crossover::PushPrimal(Basis* basis, Vector& x,
                           const std::vector<Int>& variables,
                           const Vector& z, Info* info) {
    std::valarray<bool> bound_restrict = z != 0.0;
    PushPrimal(basis, x, variables, &bound_restrict[0], info);
}